

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined1 uVar1;
  char *__filename;
  char *__s1;
  int iVar2;
  uint uVar3;
  charls_jpegls_errc cVar4;
  long lVar5;
  FILE *pFVar6;
  size_t sVar7;
  ulong uVar8;
  uint *puVar9;
  void *pvVar10;
  charls_jpegls_encoder *encoder;
  uint32_t uVar11;
  long lVar12;
  charls_spiff_resolution_units_conflict1 resolution_units;
  long lVar13;
  size_t byte_count_plane;
  ulong uVar14;
  charls_interleave_mode_conflict interleave_mode;
  char *pcVar15;
  long lVar16;
  long lVar17;
  void *__src;
  void *__src_00;
  long lVar18;
  bool bVar19;
  void *local_d0;
  void *local_c8;
  ulong local_b0;
  bmp_dib_header_t dib_header;
  bmp_header_t header;
  size_t encoded_size;
  size_t local_50;
  charls_frame_info frame_info;
  
  if (argc < 3) {
    pcVar15 = 
    "Usage: <input-filename> <output-filename> [interleave-mode (none, line or sample), default = none] [near-lossless, default=0 (lossless)]"
    ;
    goto LAB_00104579;
  }
  pcVar15 = argv[1];
  __filename = argv[2];
  uVar3 = 0;
  interleave_mode = None;
  if (argc != 3) {
    __s1 = argv[3];
    iVar2 = strcmp(__s1,"none");
    interleave_mode = None;
    if (iVar2 != 0) {
      iVar2 = strcmp(__s1,"line");
      if (iVar2 == 0) {
        interleave_mode = Line;
      }
      else {
        iVar2 = strcmp(__s1,"sample");
        if (iVar2 != 0) {
          pcVar15 = "Argument interleave-mode needs to be: none, line or sample";
          goto LAB_00104579;
        }
        interleave_mode = Sample;
      }
    }
    if ((uint)argc < 5) {
      uVar3 = 0;
    }
    else {
      lVar5 = strtol(argv[4],(char **)0x0,10);
      uVar3 = (uint)lVar5;
      if (0xff < uVar3) {
        pcVar15 = "Argument near-lossless needs to be in the range [0,255]";
        goto LAB_00104579;
      }
    }
  }
  pFVar6 = fopen(pcVar15,"rb");
  if (pFVar6 == (FILE *)0x0) {
    puVar9 = (uint *)__errno_location();
    printf("Failed to open file: %s, errno: %d\n",pcVar15,(ulong)*puVar9);
    return 1;
  }
  sVar7 = fread(&header,2,1,pFVar6);
  if (((((((sVar7 == 0) || (sVar7 = fread(&header.file_size,4,1,pFVar6), sVar7 == 0)) ||
         (sVar7 = fread(&header.reserved,4,1,pFVar6), sVar7 == 0)) ||
        ((sVar7 = fread(&header.offset,4,1,pFVar6), sVar7 == 0 || (header.magic[0] != 'B')))) ||
       (((header.magic[1] != 'M' ||
         ((sVar7 = fread(&dib_header,4,1,pFVar6), sVar7 == 0 || (dib_header.header_size < 0x28))))
        || (sVar7 = fread(&dib_header.width,4,1,pFVar6), sVar7 == 0)))) ||
      ((((sVar7 = fread(&dib_header.height,4,1,pFVar6), sVar7 == 0 ||
         (sVar7 = fread(&dib_header.number_planes,2,1,pFVar6), sVar7 == 0)) ||
        (sVar7 = fread(&dib_header.depth,2,1,pFVar6), sVar7 == 0)) ||
       (((sVar7 = fread(&dib_header.compress_type,4,1,pFVar6), sVar7 == 0 ||
         (sVar7 = fread(&dib_header.bmp_byte_size,4,1,pFVar6), sVar7 == 0)) ||
        ((sVar7 = fread(&dib_header.horizontal_resolution,4,1,pFVar6), sVar7 == 0 ||
         ((sVar7 = fread(&dib_header.vertical_resolution,4,1,pFVar6), sVar7 == 0 ||
          (sVar7 = fread(&dib_header.number_colors,4,1,pFVar6), sVar7 == 0)))))))))) ||
     (sVar7 = fread(&dib_header.number_important_colors,4,1,pFVar6), uVar11 = dib_header.height,
     sVar7 == 0)) {
    printf("Failed to read the BMP info from the file: %s\n",argv[1]);
    goto LAB_00104868;
  }
  if ((dib_header.compress_type == 0) && (dib_header.depth == 0x18)) {
    uVar8 = (ulong)dib_header.width;
    if (dib_header.height != 0 && uVar8 != 0) {
      local_c8 = (void *)0x0;
      iVar2 = fseek(pFVar6,(ulong)header.offset,0);
      if (iVar2 == 0) {
        local_b0 = uVar8 * 3 + 3 & 0xfffffffffffffffc;
        local_c8 = malloc((long)(int)uVar11 * local_b0);
        if (local_c8 != (void *)0x0) {
          sVar7 = fread(local_c8,(long)(int)uVar11 * local_b0,1,pFVar6);
          if (sVar7 == 1) goto LAB_0010492b;
          free(local_c8);
        }
        local_c8 = (void *)0x0;
      }
LAB_0010492b:
      fclose(pFVar6);
      if (local_c8 == (void *)0x0) {
        printf("Failed to read the BMP pixel data from the file: %s\n",argv[1]);
        return 1;
      }
      if ((int)uVar11 < 1) {
        dib_header.height = -uVar11;
        uVar11 = dib_header.height;
      }
      else {
        sVar7 = uVar8 * 3;
        pvVar10 = malloc(sVar7);
        if (pvVar10 == (void *)0x0) {
          pcVar15 = "Failed to convert the pixels from bottom up to top down";
LAB_00104579:
          puts(pcVar15);
          return 1;
        }
        uVar14 = (ulong)(uVar11 >> 1);
        __src_00 = (void *)(((ulong)uVar11 - 1) * local_b0 + (long)local_c8);
        __src = local_c8;
        while (bVar19 = uVar14 != 0, uVar14 = uVar14 - 1, bVar19) {
          memcpy(pvVar10,__src,sVar7);
          memcpy(__src,__src_00,sVar7);
          memcpy(__src_00,pvVar10,sVar7);
          __src_00 = (void *)((long)__src_00 - local_b0);
          __src = (void *)((long)__src + local_b0);
        }
        free(pvVar10);
      }
      lVar18 = (long)(int)uVar11;
      lVar5 = (long)local_c8 + 2;
      for (lVar12 = 0; lVar12 != lVar18; lVar12 = lVar12 + 1) {
        for (lVar13 = 0; uVar8 * 3 != lVar13; lVar13 = lVar13 + 3) {
          uVar1 = *(undefined1 *)(lVar5 + -2 + lVar13);
          *(undefined1 *)(lVar5 + -2 + lVar13) = *(undefined1 *)(lVar5 + lVar13);
          *(undefined1 *)(lVar5 + lVar13) = uVar1;
        }
        lVar5 = lVar5 + local_b0;
      }
      if ((int)uVar11 < 1) {
        __assert_fail("header->height > 0 && \"0 and negative height not supported, may cause 0 byte malloc\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/samples/convert.c/main.c"
                      ,0xc0,
                      "void *encode_bmp_to_jpegls(const void *, const size_t, const bmp_dib_header_t *, const charls_interleave_mode, const int, size_t *)"
                     );
      }
      encoder = charls_jpegls_encoder_create();
      if (encoder == (charls_jpegls_encoder *)0x0) {
        puts("Failed to create JPEG-LS encoder");
LAB_00104a9e:
        local_d0 = (void *)0x0;
      }
      else {
        frame_info.bits_per_sample = 8;
        frame_info.component_count = 3;
        frame_info.height = uVar11;
        frame_info.width = dib_header.width;
        cVar4 = charls_jpegls_encoder_set_frame_info(encoder,&frame_info);
        if (cVar4 == CHARLS_JPEGLS_ERRC_SUCCESS) {
          cVar4 = charls_jpegls_encoder_set_interleave_mode(encoder,interleave_mode);
          if (cVar4 == CHARLS_JPEGLS_ERRC_SUCCESS) {
            cVar4 = charls_jpegls_encoder_set_near_lossless(encoder,uVar3);
            if (cVar4 == CHARLS_JPEGLS_ERRC_SUCCESS) {
              cVar4 = charls_jpegls_encoder_get_estimated_destination_size(encoder,&local_50);
              if (cVar4 == CHARLS_JPEGLS_ERRC_SUCCESS) {
                local_d0 = malloc(local_50);
                if (local_d0 != (void *)0x0) {
                  cVar4 = charls_jpegls_encoder_set_destination_buffer(encoder,local_d0,local_50);
                  if (cVar4 == CHARLS_JPEGLS_ERRC_SUCCESS) {
                    if ((dib_header.vertical_resolution < 100) ||
                       (dib_header.horizontal_resolution < 100)) {
                      uVar11 = 1;
                      resolution_units = aspect_ratio;
                      uVar3 = uVar11;
                    }
                    else {
                      uVar11 = dib_header.vertical_resolution / 100;
                      uVar3 = dib_header.horizontal_resolution / 100;
                      resolution_units = dots_per_centimeter;
                    }
                    cVar4 = charls_jpegls_encoder_write_standard_spiff_header
                                      (encoder,rgb,resolution_units,uVar11,uVar3);
                    if (cVar4 == CHARLS_JPEGLS_ERRC_SUCCESS) {
                      if (interleave_mode == None) {
                        lVar5 = uVar8 * lVar18;
                        pvVar10 = malloc(lVar5 * 3);
                        if (pvVar10 == (void *)0x0) {
                          pcVar15 = "malloc";
                          cVar4 = CHARLS_JPEGLS_ERRC_NOT_ENOUGH_MEMORY;
                          goto LAB_00104c65;
                        }
                        lVar12 = (long)local_c8 + 2;
                        lVar16 = 0;
                        for (lVar13 = 0; lVar13 != lVar18; lVar13 = lVar13 + 1) {
                          for (lVar17 = 0; uVar8 * 3 != lVar17; lVar17 = lVar17 + 3) {
                            *(undefined1 *)((long)pvVar10 + lVar16) =
                                 *(undefined1 *)(lVar12 + -2 + lVar17);
                            *(undefined1 *)((long)pvVar10 + lVar16 + lVar5) =
                                 *(undefined1 *)(lVar12 + -1 + lVar17);
                            *(undefined1 *)((long)pvVar10 + lVar16 + lVar5 * 2) =
                                 *(undefined1 *)(lVar12 + lVar17);
                            lVar16 = lVar16 + 1;
                          }
                          lVar12 = lVar12 + local_b0;
                        }
                        cVar4 = charls_jpegls_encoder_encode_from_buffer
                                          (encoder,pvVar10,lVar5 * 3,0);
                        free(pvVar10);
                      }
                      else {
                        cVar4 = charls_jpegls_encoder_encode_from_buffer
                                          (encoder,local_c8,lVar18 * local_b0,(uint32_t)local_b0);
                      }
                      if (cVar4 == CHARLS_JPEGLS_ERRC_SUCCESS) {
                        cVar4 = charls_jpegls_encoder_get_bytes_written(encoder,&encoded_size);
                        if (cVar4 == CHARLS_JPEGLS_ERRC_SUCCESS) {
                          charls_jpegls_encoder_destroy(encoder);
                          goto LAB_00104b1c;
                        }
                        pcVar15 = "get bytes written";
                      }
                      else {
                        pcVar15 = "encode";
                      }
                    }
                    else {
                      pcVar15 = "write_standard_spiff_header";
                    }
                  }
                  else {
                    pcVar15 = "set destination buffer";
                  }
LAB_00104c65:
                  handle_encoder_failure(cVar4,pcVar15,encoder,local_d0);
                  goto LAB_00104a9e;
                }
                pcVar15 = "malloc failed";
                cVar4 = CHARLS_JPEGLS_ERRC_SUCCESS;
              }
              else {
                pcVar15 = "get estimated destination size";
              }
            }
            else {
              pcVar15 = "set near lossless";
            }
          }
          else {
            pcVar15 = "set near interleave mode";
          }
        }
        else {
          pcVar15 = "set frame_info";
        }
        local_d0 = (void *)0x0;
        handle_encoder_failure(cVar4,pcVar15,encoder,(void *)0x0);
      }
LAB_00104b1c:
      free(local_c8);
      if (local_d0 == (void *)0x0) {
        return 1;
      }
      if (__filename == (char *)0x0) {
        __assert_fail("filename",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/samples/convert.c/main.c"
                      ,299,"_Bool save_jpegls_file(const char *, const void *, const size_t)");
      }
      if (encoded_size == 0) {
        __assert_fail("buffer_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/samples/convert.c/main.c"
                      ,0x12d,"_Bool save_jpegls_file(const char *, const void *, const size_t)");
      }
      pFVar6 = fopen(__filename,"wb");
      if ((pFVar6 == (FILE *)0x0) || (sVar7 = fwrite(local_d0,encoded_size,1,pFVar6), sVar7 == 0)) {
        free(local_d0);
      }
      else {
        iVar2 = fclose(pFVar6);
        free(local_d0);
        if (iVar2 == 0) {
          return 0;
        }
      }
      printf("Failed to write encoded data to the file: %s\n",__filename);
      return 1;
    }
    pcVar15 = "Can only process an image that is 1 x 1 or bigger";
  }
  else {
    pcVar15 = "Can only convert uncompressed 24 bits BMP files";
  }
  printf(pcVar15);
LAB_00104868:
  fclose(pFVar6);
  return 1;
}

Assistant:

int main(const int argc, char* argv[])
{
    options_t options;
    if (!parse_command_line_options(argc, argv, &options))
        return EXIT_FAILURE;

    FILE* input_stream = fopen(options.input_filename, "rb");
    if (!input_stream)
    {
        printf("Failed to open file: %s, errno: %d\n", options.input_filename, errno);
        return EXIT_FAILURE;
    }

    bmp_header_t header;
    bmp_dib_header_t dib_header;
    if (!bmp_read_header(input_stream, &header) || !bmp_read_dib_header(input_stream, &dib_header))
    {
        printf("Failed to read the BMP info from the file: %s\n", argv[1]);
        (void) fclose(input_stream);
        return EXIT_FAILURE;
    }

    if (dib_header.compress_type != 0 || dib_header.depth != 24)
    {
        printf("Can only convert uncompressed 24 bits BMP files");
        (void) fclose(input_stream);
        return EXIT_FAILURE;
    }

    if (dib_header.width == 0 || dib_header.height == 0)
    {
        printf("Can only process an image that is 1 x 1 or bigger");
        (void) fclose(input_stream);
        return EXIT_FAILURE;
    }

    size_t stride;
    void* pixel_data = bmp_read_pixel_data(input_stream, header.offset, &dib_header, &stride);
    (void ) fclose(input_stream);

    if (!pixel_data)
    {
        printf("Failed to read the BMP pixel data from the file: %s\n", argv[1]);
        return EXIT_FAILURE;
    }

    // Pixels in the BMP file format are stored bottom up (when the height parameter is positive), JPEG-LS requires top down.
    if (dib_header.height > 0)
    {
        if (!convert_bottom_up_to_top_down(pixel_data, dib_header.width, (size_t)dib_header.height, stride))
        {
            printf("Failed to convert the pixels from bottom up to top down\n");
            return EXIT_FAILURE;
        }
    }
    else
    {
        dib_header.height = abs(dib_header.height);
    }

    // Pixels in the BMP file format are stored as BGR. JPEG-LS (SPIFF header) only supports the RGB color model.
    // Note: without the optional SPIFF header no color information is stored in the JPEG-LS file and the common assumption
    // is RGB.
    convert_bgr_to_rgb(pixel_data, dib_header.width, (size_t)dib_header.height, stride);

    size_t encoded_size;
    void* encoded_data =
        encode_bmp_to_jpegls(pixel_data, stride, &dib_header, options.interleave_mode, options.near_lossless, &encoded_size);
    free(pixel_data);
    if (!encoded_data)
        return EXIT_FAILURE; // error already printed.

    const bool result = save_jpegls_file(options.output_filename, encoded_data, encoded_size);
    free(encoded_data);
    if (!result)
    {
        printf("Failed to write encoded data to the file: %s\n", options.output_filename);
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;
}